

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int StackToolFormatLevelInfo
              (ImGuiIDStackTool *tool,int n,bool format_for_ui,char *buf,size_t buf_size)

{
  ImGuiStackLevelInfo *pIVar1;
  char *in_RCX;
  byte in_DL;
  char *pcVar2;
  int in_ESI;
  long in_RDI;
  size_t in_R8;
  bool bVar3;
  ImGuiWindow *window;
  ImGuiStackLevelInfo *info;
  undefined8 in_stack_ffffffffffffffb0;
  ImGuiID id;
  ImGuiWindow *local_40;
  int local_4;
  
  id = (ImGuiID)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  pIVar1 = ImVector<ImGuiStackLevelInfo>::operator[]
                     ((ImVector<ImGuiStackLevelInfo> *)(in_RDI + 0x10),in_ESI);
  if ((pIVar1->Desc[0] == '\0') && (in_ESI == 0)) {
    local_40 = ImGui::FindWindowByID(id);
  }
  else {
    local_40 = (ImGuiWindow *)0x0;
  }
  if (local_40 == (ImGuiWindow *)0x0) {
    if ((pIVar1->QuerySuccess & 1U) == 0) {
      if (*(int *)(in_RDI + 4) < *(int *)(in_RDI + 0x10)) {
        *in_RCX = '\0';
        local_4 = 0;
      }
      else {
        local_4 = ImFormatString(in_RCX,in_R8,"???");
      }
    }
    else {
      bVar3 = false;
      if ((in_DL & 1) != 0) {
        bVar3 = pIVar1->field_0x6 == '\f';
      }
      pcVar2 = "%s";
      if (bVar3) {
        pcVar2 = "\"%s\"";
      }
      local_4 = ImFormatString(in_RCX,in_R8,pcVar2,pIVar1->Desc);
    }
  }
  else {
    pcVar2 = "%s";
    if ((in_DL & 1) != 0) {
      pcVar2 = "\"%s\" [window]";
    }
    local_4 = ImFormatString(in_RCX,in_R8,pcVar2,local_40->Name);
  }
  return local_4;
}

Assistant:

static int StackToolFormatLevelInfo(ImGuiIDStackTool* tool, int n, bool format_for_ui, char* buf, size_t buf_size)
{
    ImGuiStackLevelInfo* info = &tool->Results[n];
    ImGuiWindow* window = (info->Desc[0] == 0 && n == 0) ? ImGui::FindWindowByID(info->ID) : NULL;
    if (window)                                                                 // Source: window name (because the root ID don't call GetID() and so doesn't get hooked)
        return ImFormatString(buf, buf_size, format_for_ui ? "\"%s\" [window]" : "%s", window->Name);
    if (info->QuerySuccess)                                                     // Source: GetID() hooks (prioritize over ItemInfo() because we frequently use patterns like: PushID(str), Button("") where they both have same id)
        return ImFormatString(buf, buf_size, (format_for_ui && info->DataType == ImGuiDataType_String) ? "\"%s\"" : "%s", info->Desc);
    if (tool->StackLevel < tool->Results.Size)                                  // Only start using fallback below when all queries are done, so during queries we don't flickering ??? markers.
        return (*buf = 0);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (const char* label = ImGuiTestEngine_FindItemDebugLabel(GImGui, info->ID))   // Source: ImGuiTestEngine's ItemInfo()
        return ImFormatString(buf, buf_size, format_for_ui ? "??? \"%s\"" : "%s", label);
#endif
    return ImFormatString(buf, buf_size, "???");
}